

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::createInstance(WindingTest *this,Context *context)

{
  bool bVar1;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  TestInstance *pTVar2;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,1);
  pTVar2 = (TestInstance *)operator_new(0x20);
  bVar1 = this->m_yFlip;
  pTVar2->m_context = context;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d354b0;
  pTVar2[1]._vptr_TestInstance = *(_func_int ***)&this->m_primitiveType;
  *(bool *)&pTVar2[1].m_context = bVar1;
  return pTVar2;
}

Assistant:

TestInstance* WindingTest::createInstance (Context& context) const
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER);

	return new WindingTestInstance(context, m_primitiveType, m_winding, m_yFlip);
}